

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

bool __thiscall QCalendarWidget::eventFilter(QCalendarWidget *this,QObject *watched,QEvent *event)

{
  QCalendarWidgetPrivate *this_00;
  QWidgetData *pQVar1;
  bool bVar2;
  undefined1 uVar3;
  char cVar4;
  undefined4 uVar5;
  uint uVar6;
  QWidget *parent;
  QWidget *pQVar7;
  ulong uVar8;
  QWidget *this_01;
  ulong uVar9;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar10 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar11 [16];
  QPoint mousePos;
  QPoint local_60;
  QPoint local_58;
  undefined8 uStack_50;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(event + 8) == 2) {
    this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
    bVar2 = QWidget::hasFocus((QWidget *)this_00->yearEdit);
    if (bVar2) {
      parent = QWidget::window(&this->super_QWidget);
      if (watched == (QObject *)0x0) {
        this_01 = (QWidget *)0x0;
      }
      else {
        this_01 = (QWidget *)0x0;
        if ((*(byte *)(*(long *)(watched + 8) + 0x30) & 1) != 0) {
          this_01 = (QWidget *)watched;
        }
      }
      if ((this_01 == (QWidget *)0x0) || (pQVar7 = QWidget::window(this_01), pQVar7 != parent)) {
        uVar3 = QObject::eventFilter((QObject *)this,(QEvent *)watched);
        cVar4 = '\0';
      }
      else {
        local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        uVar5 = QEventPoint::position();
        auVar11._0_8_ =
             (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa;
        auVar11._8_8_ =
             (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM0_Qa;
        auVar11 = minpd(_DAT_0066f5d0,auVar11);
        auVar10._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
        auVar10._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
        uVar6 = movmskpd(uVar5,auVar10);
        uVar9 = 0x8000000000000000;
        if ((uVar6 & 1) != 0) {
          uVar9 = (ulong)(uint)(int)auVar11._0_8_ << 0x20;
        }
        uVar8 = 0x80000000;
        if ((uVar6 & 2) != 0) {
          uVar8 = (ulong)(uint)(int)auVar11._8_8_;
        }
        local_58 = (QPoint)(uVar8 | uVar9);
        local_40 = QWidget::mapTo(this_01,parent,&local_58);
        local_58 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_60.xp.m_i = 0;
        local_60.yp.m_i = 0;
        local_58 = QWidget::mapTo((QWidget *)this_00->yearEdit,parent,&local_60);
        pQVar1 = (this_00->yearEdit->super_QAbstractSpinBox).super_QWidget.data;
        uStack_50 = (undefined1 *)
                    CONCAT44(((pQVar1->crect).y2.m_i + local_58.yp.m_i.m_i) - (pQVar1->crect).y1.m_i
                             ,((pQVar1->crect).x2.m_i + local_58.xp.m_i.m_i) -
                              (pQVar1->crect).x1.m_i);
        cVar4 = QRect::contains(&local_58,SUB81(&local_40,0));
        if (cVar4 == '\0') {
          event[0xc] = (QEvent)0x1;
          QCalendarWidgetPrivate::_q_yearEditingFinished(this_00);
          QWidget::setFocus(&this->super_QWidget,OtherFocusReason);
        }
        uVar3 = 1;
      }
      if (cVar4 == '\0') goto LAB_003d4245;
    }
  }
  uVar3 = QObject::eventFilter((QObject *)this,(QEvent *)watched);
LAB_003d4245:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool QCalendarWidget::eventFilter(QObject *watched, QEvent *event)
{
    Q_D(QCalendarWidget);
    if (event->type() == QEvent::MouseButtonPress && d->yearEdit->hasFocus()) {
        // We can get filtered press events that were intended for Qt Virtual Keyboard's
        // input panel (QQuickView), so we have to make sure that the window is indeed a QWidget - no static_cast.
        // In addition, as we have a event filter on the whole application we first make sure that the top level widget
        // of both this and the watched widget are the same to decide if we should finish the year edition.
        QWidget *tlw = window();
        QWidget *widget = qobject_cast<QWidget *>(watched);
        if (!widget || widget->window() != tlw)
            return QWidget::eventFilter(watched, event);

        QPoint mousePos = widget->mapTo(tlw, static_cast<QMouseEvent *>(event)->position().toPoint());
        QRect geom = QRect(d->yearEdit->mapTo(tlw, QPoint(0, 0)), d->yearEdit->size());
        if (!geom.contains(mousePos)) {
            event->accept();
            d->_q_yearEditingFinished();
            setFocus();
            return true;
        }
    }
    return QWidget::eventFilter(watched, event);
}